

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O0

void __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
          (input_stream_t<cfgfile::qstring_trait_t> *this,string_t *file_name,istream_t *input)

{
  pos_t pVar1;
  pos_t in_RDX;
  pos_t *in_RDI;
  qstring_wrapper_t *in_stack_ffffffffffffffa8;
  stack<QChar,_std::deque<QChar,_std::allocator<QChar>_>_> *in_stack_ffffffffffffffb0;
  pos_t *size;
  pos_t *buf_size;
  buf_t *in_stack_ffffffffffffffd8;
  istream_t *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RDX;
  in_RDI[1] = 1;
  in_RDI[2] = 1;
  std::
  stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>>>
  ::
  stack<std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>>,void>
            ((stack<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::deque<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>_>
              *)in_stack_ffffffffffffffb0);
  size = in_RDI + 0xd;
  qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  buf_size = in_RDI + 0x10;
  std::stack<QChar,std::deque<QChar,std::allocator<QChar>>>::
  stack<std::deque<QChar,std::allocator<QChar>>,void>(in_stack_ffffffffffffffb0);
  QString::QString((QString *)0x16aaf6);
  in_RDI[0x1d] = 0;
  in_RDI[0x1f] = 0;
  qstring_trait_t::noskipws((istream_t *)*in_RDI);
  pVar1 = qstring_trait_t::size_of_file((istream_t *)*in_RDI);
  in_RDI[0x1e] = pVar1;
  if (in_RDI[0x1e] < 0) {
    in_RDI[0x1e] = 0;
  }
  qstring_trait_t::fill_buf
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(pos_t)buf_size,in_RDI,(pos_t)size)
  ;
  return;
}

Assistant:

input_stream_t( const typename Trait::string_t & file_name,
		typename Trait::istream_t & input )
		:	m_stream( input )
		,	m_line_number( 1 )
		,	m_column_number( 1 )
		,	m_file_name( file_name )
		,	m_buf_pos( 0 )
		,	m_stream_pos( 0 )
	{
		Trait::noskipws( m_stream );

		m_stream_size = Trait::size_of_file( m_stream );

		if( m_stream_size < 0 )
			m_stream_size = 0;

		Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
	}